

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qunicodetools.cpp
# Opt level: O3

State QUnicodeTools::LB::BRS::updateState(State state,LinebreakUnit lb)

{
  LineBreakClass LVar1;
  char32_t cVar2;
  
  LVar1 = lb.lbc;
  if (LVar1 != LineBreak_CM) {
    cVar2 = lb.ucs4;
    switch(state) {
    case None:
      state = Start;
      if (cVar2 != L'◌') {
        return (State)((LVar1 - LineBreak_AK & 0xfffffffd) == 0);
      }
      break;
    case Start:
      if (LVar1 == LineBreak_VF) {
        return LB28a_2VF;
      }
      if (LVar1 == LineBreak_VI) {
        return LB28a_2VI;
      }
      state = LB28a_4;
      if (cVar2 != L'◌') {
        return (uint)((LVar1 - LineBreak_AK & 0xfffffffd) == 0) * 5;
      }
      break;
    case LB28a_2VI:
      if (LVar1 == LineBreak_AK || cVar2 == L'◌') {
        return LB28a_3VIAK;
      }
    default:
      state = None;
      break;
    case LB28a_4:
      return LVar1 == LineBreak_VF ^ Restart;
    }
  }
  return state;
}

Assistant:

State updateState(State state, LinebreakUnit lb)
    {
        using LBC = QUnicodeTables::LineBreakClass;
        if (lb.lbc == LBC::LineBreak_CM)
            return state;

        switch (state) {
        case Start:
            if (lb.lbc == LBC::LineBreak_VF)
                return LB28a_2VF;
            if (lb.lbc == LBC::LineBreak_VI)
                return LB28a_2VI;
            if (lb.ucs4 == DottedCircle || lb.lbc == LBC::LineBreak_AK
                || lb.lbc == LBC::LineBreak_AS)
                return LB28a_4;
            break;
        case LB28a_2VI:
            if (lb.ucs4 == DottedCircle || lb.lbc == LBC::LineBreak_AK)
                return LB28a_3VIAK;
            break;
        case LB28a_4:
            if (lb.lbc == LBC::LineBreak_VF)
                return LB28a_4VF;
            // Had (AK | [◌] | AS) (AK | [◌] | AS), which could mean the 2nd capture is the start
            // of a new sequence, so we need to check if it makes sense.
            return Restart;
        case None:
            if (Q_UNLIKELY(lb.ucs4 == DottedCircle || lb.lbc == LBC::LineBreak_AK
                           || lb.lbc == LBC::LineBreak_AS)) {
                return Start;
            }
            break;
        case LB28a_2VF:
        case LB28a_4VF:
        case LB28a_3VIAK:
        case Restart:
            // These are all terminal states, so no need to update
            Q_UNREACHABLE();
        }
        return None;
    }